

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

bool MovementsLegal(Movement move,Situation *situation)

{
  uint position;
  uint position_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *in_RDX;
  undefined8 in_RDI;
  int i;
  int horse_leg;
  int to_row;
  int to_col;
  int from_row;
  int from_col;
  int piece_id_from;
  int player;
  int player_flag;
  int to;
  int from;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  int local_54;
  byte local_10;
  byte bStack_f;
  char cStack_e;
  bool local_1;
  
  local_10 = (byte)in_RDI;
  position = (uint)local_10;
  bStack_f = (byte)((ulong)in_RDI >> 8);
  position_00 = (uint)bStack_f;
  uVar1 = GetPlayerFlag(*in_RDX);
  iVar3 = *in_RDX;
  uVar2 = (uint)*(byte *)((long)in_RDX + (long)(int)position + 4);
  if ((uVar2 & uVar1) == 0) {
    local_1 = false;
  }
  else {
    cStack_e = (char)((ulong)in_RDI >> 0x10);
    if (*(char *)((long)in_RDX + (long)(int)position_00 + 4) == cStack_e) {
      switch(uVar2 - uVar1) {
      case 0:
        local_61 = false;
        if ((LEGAL_POSITION[iVar3][(int)position_00] & 2) != 0) {
          local_61 = ""[(int)((position_00 - position) + 0x100)] == '\x01';
        }
        local_1 = local_61;
        break;
      case 1:
      case 2:
        local_62 = false;
        if ((LEGAL_POSITION[iVar3][(int)position_00] & 4) != 0) {
          local_62 = ""[(int)((position_00 - position) + 0x100)] == '\x02';
        }
        local_1 = local_62;
        break;
      case 3:
      case 4:
        local_63 = false;
        if (((LEGAL_POSITION[iVar3][(int)position_00] & 0x10) != 0) &&
           (local_63 = false, ""[(int)((position_00 - position) + 0x100)] == '\x03')) {
          local_63 = *(char *)((long)in_RDX + (long)((int)(position_00 + position) >> 1) + 4) ==
                     '\0';
        }
        local_1 = local_63;
        break;
      case 5:
      case 6:
        local_64 = false;
        if (HORSE_LEGAL_MOVE[(int)((position_00 - position) + 0x100)] + position != position) {
          local_64 = *(char *)((long)in_RDX +
                              (long)(int)(HORSE_LEGAL_MOVE[(int)((position_00 - position) + 0x100)]
                                         + position) + 4) == '\0';
        }
        local_1 = local_64;
        break;
      case 7:
      case 8:
        iVar3 = GetCol(position);
        iVar4 = GetRow(position);
        iVar5 = GetCol(position_00);
        iVar6 = GetRow(position_00);
        if (iVar3 == iVar5) {
          if (cStack_e == '\0') {
            local_1 = (ROOK_CANNON_CAN_GET_COL_MASK[iVar4 + -3]
                       [*(ushort *)((long)in_RDX + (long)iVar3 * 2 + 0x154)].no_capture &
                      BIT_COL_MASK[(int)position_00]) != 0;
          }
          else {
            local_1 = (*(ushort *)
                        ((long)(iVar4 + -3) * 0x2000 + 0x339d82 +
                        (ulong)*(ushort *)((long)in_RDX + (long)iVar3 * 2 + 0x154) * 8) &
                      BIT_COL_MASK[(int)position_00]) != 0;
          }
        }
        else if (iVar4 == iVar6) {
          if (cStack_e == '\0') {
            local_1 = (ROOK_CANNON_CAN_GET_ROW_MASK[iVar3 + -3]
                       [*(ushort *)((long)in_RDX + (long)iVar4 * 2 + 0x134)].no_capture &
                      BIT_ROW_MASK[(int)position_00]) != 0;
          }
          else {
            local_1 = (*(ushort *)
                        ((long)(iVar3 + -3) * 0x1000 + 0x330d82 +
                        (ulong)*(ushort *)((long)in_RDX + (long)iVar4 * 2 + 0x134) * 8) &
                      BIT_ROW_MASK[(int)position_00]) != 0;
          }
        }
        else {
          local_1 = false;
        }
        break;
      case 9:
      case 10:
        iVar3 = GetCol(position);
        iVar4 = GetRow(position);
        iVar5 = GetCol(position_00);
        iVar6 = GetRow(position_00);
        if (iVar3 == iVar5) {
          if (cStack_e == '\0') {
            local_1 = (ROOK_CANNON_CAN_GET_COL_MASK[iVar4 + -3]
                       [*(ushort *)((long)in_RDX + (long)iVar3 * 2 + 0x154)].no_capture &
                      BIT_COL_MASK[(int)position_00]) != 0;
          }
          else {
            local_1 = (*(ushort *)
                        ((long)(iVar4 + -3) * 0x2000 + 0x339d84 +
                        (ulong)*(ushort *)((long)in_RDX + (long)iVar3 * 2 + 0x154) * 8) &
                      BIT_COL_MASK[(int)position_00]) != 0;
          }
        }
        else if (iVar4 == iVar6) {
          if (cStack_e == '\0') {
            local_1 = (ROOK_CANNON_CAN_GET_ROW_MASK[iVar3 + -3]
                       [*(ushort *)((long)in_RDX + (long)iVar4 * 2 + 0x134)].no_capture &
                      BIT_ROW_MASK[(int)position_00]) != 0;
          }
          else {
            local_1 = (*(ushort *)
                        ((long)(iVar3 + -3) * 0x1000 + 0x330d84 +
                        (ulong)*(ushort *)((long)in_RDX + (long)iVar4 * 2 + 0x134) * 8) &
                      BIT_ROW_MASK[(int)position_00]) != 0;
          }
        }
        else {
          local_1 = false;
        }
        break;
      default:
        if ((LEGAL_POSITION[iVar3][(int)position_00] & 8) == 0) {
          local_1 = false;
        }
        else {
          for (local_54 = 0; PAWN_CAN_GET[(int)position][iVar3][local_54] != 0;
              local_54 = local_54 + 1) {
            if (PAWN_CAN_GET[(int)position][iVar3][local_54] == position_00) {
              return true;
            }
          }
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool MovementsLegal(const Movement move, const Situation & situation){
    int from = move.from, to = move.to, player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int piece_id_from = situation.current_board[from];
    int from_col = 0, from_row = 0, to_col = 0, to_row = 0;
    // 1. 判断出发点是否为自己的棋子(包含判断是否是没有棋子)
    if((piece_id_from & player_flag) == 0){
        return false;
    }
    // 2. 对目标点进行判断
    if(situation.current_board[to] != move.capture){
        return false;
    }
    // 3.对出发点的棋子进行分类讨论
    switch (piece_id_from - player_flag){
    // 3.1 将(帅)
    case 0:
        return (LEGAL_POSITION[player][to] & POSITION_MASK[0]) && (LEGAL_MOVE[to - from + 256] == 1);
    // 3.2 仕
    case 1:
    case 2:
        return (LEGAL_POSITION[player][to] & POSITION_MASK[1]) && (LEGAL_MOVE[to - from + 256] == 2);
    // 3.3 象
    case 3:
    case 4:
        return (LEGAL_POSITION[player][to] & POSITION_MASK[2]) && (LEGAL_MOVE[to - from + 256] == 3) && (situation.current_board[(to + from) >> 1] == 0);
    // 3.4 马
    case 5:
    case 6: {
        int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
        return (horse_leg != from) && (situation.current_board[horse_leg] == 0);
    }
    // 3.5 车
    case 7:
    case 8:
        from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);
        // 3.5.1 如果在同一列
        if(from_col == to_col){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].no_capture & BIT_COL_MASK[to]) != 0;
            }
        }
        // 3.5.2 如果在同一行
        else if(from_row == to_row){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].no_capture & BIT_ROW_MASK[to]) != 0;
            }
        }
        // 3.5.2 不在同一行列
        else{
            return false;
        }
    // 3.6 炮
    case 9:
    case 10:
        from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);
        // 3.6.1 如果在同一列
        if(from_col == to_col){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].no_capture & BIT_COL_MASK[to]) != 0;
            }
        }
        // 3.6.2 如果在同一行
        else if(from_row == to_row){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].no_capture & BIT_ROW_MASK[to]) != 0;
            }
        }
        // 3.6.2 不在同一行列
        else{
            return false;
        }
    // 3.7 兵
    default:
        if(!(LEGAL_POSITION[player][to] & POSITION_MASK[6])){
            return false;
        }
        for(int i = 0; PAWN_CAN_GET[from][player][i] != 0; i ++){
            if(PAWN_CAN_GET[from][player][i] == to){
                return true;
            }
        }
        return false;
    }
}